

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O2

void secp256k1_dleq_challenge_hash
               (secp256k1_scalar *e,uchar *algo16,secp256k1_ge *gen2,secp256k1_ge *r1,
               secp256k1_ge *r2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  int iVar1;
  uchar buf32 [32];
  secp256k1_sha256 sha;
  uchar local_b8 [32];
  secp256k1_sha256 local_98;
  
  iVar1 = algo16_len((uchar *)"ECDSAAdaptorSig");
  secp256k1_sha256_initialize_tagged(&local_98,(uchar *)"ECDSAAdaptorSig",(long)iVar1);
  secp256k1_dleq_hash_point(&local_98,(secp256k1_ge *)algo16);
  secp256k1_dleq_hash_point(&local_98,gen2);
  secp256k1_dleq_hash_point(&local_98,r1);
  secp256k1_dleq_hash_point(&local_98,r2);
  secp256k1_dleq_hash_point(&local_98,p1);
  secp256k1_sha256_finalize(&local_98,local_b8);
  secp256k1_scalar_set_b32(e,local_b8,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_dleq_challenge_hash(secp256k1_scalar *e, const unsigned char *algo16, const secp256k1_ge *gen2, const secp256k1_ge *r1, const secp256k1_ge *r2, const secp256k1_ge *p1, const secp256k1_ge *p2) {
    secp256k1_sha256 sha;
    unsigned char buf32[32];

    secp256k1_sha256_initialize_tagged(&sha, algo16, algo16_len(algo16));
    secp256k1_dleq_hash_point(&sha, gen2);
    secp256k1_dleq_hash_point(&sha, r1);
    secp256k1_dleq_hash_point(&sha, r2);
    secp256k1_dleq_hash_point(&sha, p1);
    secp256k1_dleq_hash_point(&sha, p2);
    secp256k1_sha256_finalize(&sha, buf32);

    secp256k1_scalar_set_b32(e, buf32, NULL);
}